

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O2

void __thiscall miniros::Subscription::addLocalConnection(Subscription *this,PublicationPtr *pub)

{
  Publication *this_00;
  RPCManagerPtr *pRVar1;
  IntraProcessSubscriberLinkPtr sub_link;
  __shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  IntraProcessPublisherLinkPtr pub_link;
  
  std::mutex::lock(&this->publisher_links_mutex_);
  if (this->dropped_ == false) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (addLocalConnection::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&pub_link,"miniros.subscription",(allocator<char> *)&sub_link);
      console::initializeLogLocation(&addLocalConnection::loc,(string *)&pub_link,Debug);
      std::__cxx11::string::~string((string *)&pub_link);
    }
    if (addLocalConnection::loc.level_ != Debug) {
      console::setLogLocationLevel(&addLocalConnection::loc,Debug);
      console::checkLogLocationEnabled(&addLocalConnection::loc);
    }
    if (addLocalConnection::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,addLocalConnection::loc.logger_,
                     addLocalConnection::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/subscription.cpp"
                     ,0xc5,"void miniros::Subscription::addLocalConnection(const PublicationPtr &)",
                     "Creating intraprocess link for topic [%s]",(this->name_)._M_dataplus._M_p);
    }
    std::__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::Subscription,void>
              ((__shared_ptr<miniros::Subscription,(__gnu_cxx::_Lock_policy)2> *)&sub_link,
               (__weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<miniros::Subscription>);
    pRVar1 = RPCManager::instance();
    std::
    make_shared<miniros::IntraProcessPublisherLink,std::shared_ptr<miniros::Subscription>,std::__cxx11::string_const&,miniros::TransportHints&>
              ((shared_ptr<miniros::Subscription> *)&pub_link,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sub_link,
               (TransportHints *)
               (pRVar1->super___shared_ptr<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sub_link.
                super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    make_shared<miniros::IntraProcessSubscriberLink,std::shared_ptr<miniros::Publication>const&>
              ((shared_ptr<miniros::Publication> *)&sub_link);
    IntraProcessPublisherLink::setPublisher
              (pub_link.
               super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&sub_link);
    IntraProcessSubscriberLink::setSubscriber
              (sub_link.
               super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&pub_link);
    std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::IntraProcessPublisherLink,void>
              (local_50,&pub_link.
                         super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>
              );
    std::
    vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
    ::push_back(&this->publisher_links_,(value_type *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    this_00 = (pub->super___shared_ptr<miniros::Publication,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<miniros::SubscriberLink,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::IntraProcessSubscriberLink,void>
              ((__shared_ptr<miniros::SubscriberLink,(__gnu_cxx::_Lock_policy)2> *)local_50,
               &sub_link.
                super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>)
    ;
    Publication::addSubscriberLink(this_00,(SubscriberLinkPtr *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sub_link.
                super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pub_link.
                super___shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->publisher_links_mutex_);
  return;
}

Assistant:

void Subscription::addLocalConnection(const PublicationPtr& pub)
{
  std::scoped_lock<std::mutex> lock(publisher_links_mutex_);
  if (dropped_)
  {
    return;
  }

  MINIROS_DEBUG("Creating intraprocess link for topic [%s]", name_.c_str());

  IntraProcessPublisherLinkPtr pub_link(std::make_shared<IntraProcessPublisherLink>(shared_from_this(), RPCManager::instance()->getServerURI(), transport_hints_));
  IntraProcessSubscriberLinkPtr sub_link(std::make_shared<IntraProcessSubscriberLink>(pub));
  pub_link->setPublisher(sub_link);
  sub_link->setSubscriber(pub_link);

  addPublisherLink(pub_link);
  pub->addSubscriberLink(sub_link);
}